

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plt-elf.c
# Opt level: O3

size_t get_offsets(plt_ctx ctx,plt_lib lib,char *name,plt_offset **offsets)

{
  link_map *plVar1;
  Elf64_Addr EVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  link_map *plVar6;
  plt_offset *ppVar7;
  link_map *plVar8;
  link_map **pplVar9;
  link_map *plVar10;
  ulong uVar11;
  char **ppcVar12;
  link_map *plVar13;
  rel_info info [2];
  size_t local_88;
  link_map *local_68;
  link_map *local_60;
  char *local_58;
  link_map *local_50;
  link_map *local_48;
  char *local_40;
  
  plVar6 = (link_map *)lib->l_addr;
  if (plVar6 != (link_map *)0x0) {
    pplVar9 = (link_map **)&lib->l_ld;
    plVar13 = (link_map *)0x0;
    plVar8 = plVar6;
    do {
      if (plVar8 == (link_map *)0x6) {
        plVar13 = pplVar9[-1];
        if ((link_map *)0xfeffffffffffffff < plVar13 || plVar13 < ctx) {
          plVar13 = (link_map *)((long)&ctx->r_version + (long)&plVar13->l_addr);
        }
        break;
      }
      plVar8 = *pplVar9;
      pplVar9 = pplVar9 + 2;
    } while (plVar8 != (link_map *)0x0);
    pplVar9 = (link_map **)&lib->l_ld;
    plVar10 = (link_map *)0x0;
    plVar8 = plVar6;
    do {
      if (plVar8 == (link_map *)0x5) {
        plVar10 = pplVar9[-1];
        if ((link_map *)0xfeffffffffffffff < plVar10 || plVar10 < ctx) {
          plVar10 = (link_map *)((long)&ctx->r_version + (long)&plVar10->l_addr);
        }
        break;
      }
      plVar8 = *pplVar9;
      pplVar9 = pplVar9 + 2;
    } while (plVar8 != (link_map *)0x0);
    pplVar9 = (link_map **)&lib->l_ld;
    local_50 = (link_map *)0x0;
    plVar8 = plVar6;
    do {
      if (plVar8 == (link_map *)0x17) {
        local_50 = pplVar9[-1];
        if ((link_map *)0xfeffffffffffffff < local_50 || local_50 < ctx) {
          local_50 = (link_map *)((long)&ctx->r_version + (long)&local_50->l_addr);
        }
        break;
      }
      plVar8 = *pplVar9;
      pplVar9 = pplVar9 + 2;
    } while (plVar8 != (link_map *)0x0);
    pplVar9 = (link_map **)&lib->l_ld;
    local_48 = (link_map *)0x0;
    plVar8 = plVar6;
    do {
      if (plVar8 == (link_map *)0x2) {
        local_48 = pplVar9[-1];
        break;
      }
      plVar8 = *pplVar9;
      pplVar9 = pplVar9 + 2;
    } while (plVar8 != (link_map *)0x0);
    pplVar9 = (link_map **)&lib->l_ld;
    plVar8 = plVar6;
    do {
      if (plVar8 == (link_map *)0x7) {
        plVar1 = pplVar9[-1];
        plVar8 = (link_map *)((long)&plVar1->l_addr + (long)&ctx->r_version);
        local_68 = plVar1;
        if ((link_map *)0xfeffffffffffffff < plVar1) {
          local_68 = plVar8;
        }
        if (plVar1 < ctx) {
          local_68 = plVar8;
        }
        if (local_68 != (link_map *)0x0) {
          pplVar9 = (link_map **)&lib->l_ld;
          local_60 = (link_map *)0x0;
          plVar8 = plVar6;
          goto LAB_00108084;
        }
        break;
      }
      plVar8 = *pplVar9;
      pplVar9 = pplVar9 + 2;
    } while (plVar8 != (link_map *)0x0);
    pplVar9 = (link_map **)&lib->l_ld;
    plVar8 = plVar6;
    do {
      if (plVar8 == (link_map *)0x11) {
        plVar1 = pplVar9[-1];
        plVar8 = (link_map *)((long)&plVar1->l_addr + (long)&ctx->r_version);
        local_68 = plVar1;
        if ((link_map *)0xfeffffffffffffff < plVar1) {
          local_68 = plVar8;
        }
        if (plVar1 < ctx) {
          local_68 = plVar8;
        }
        if (local_68 == (link_map *)0x0) {
          return 0;
        }
        pplVar9 = (link_map **)&lib->l_ld;
        local_60 = (link_map *)0x0;
        plVar8 = plVar6;
        goto LAB_001080db;
      }
      plVar8 = *pplVar9;
      pplVar9 = pplVar9 + 2;
    } while (plVar8 != (link_map *)0x0);
  }
  return 0;
  while( true ) {
    plVar8 = *pplVar9;
    pplVar9 = pplVar9 + 2;
    if (plVar8 == (link_map *)0x0) break;
LAB_00108084:
    if (plVar8 == (link_map *)0x8) {
      local_60 = pplVar9[-1];
      break;
    }
  }
  local_58 = (char *)0x0;
  do {
    if (plVar6 == (link_map *)0x9) goto LAB_00108138;
    plVar6 = (link_map *)lib->l_ld;
    lib = (plt_lib)&lib->l_ld;
  } while (plVar6 != (link_map *)0x0);
  goto LAB_0010813c;
LAB_00108138:
  local_58 = lib->l_name;
  goto LAB_0010813c;
  while( true ) {
    plVar8 = *pplVar9;
    pplVar9 = pplVar9 + 2;
    if (plVar8 == (link_map *)0x0) break;
LAB_001080db:
    if (plVar8 == (link_map *)0x12) {
      local_60 = pplVar9[-1];
      break;
    }
  }
  local_58 = (char *)0x0;
  do {
    if (plVar6 == (link_map *)0x13) goto LAB_00108138;
    plVar6 = (link_map *)lib->l_ld;
    lib = (plt_lib)&lib->l_ld;
  } while (plVar6 != (link_map *)0x0);
LAB_0010813c:
  local_88 = 0;
  if ((plVar13 != (link_map *)0x0) && (plVar10 != (link_map *)0x0)) {
    local_88 = 0;
    if ((local_60 != (link_map *)0x0 || local_48 != (link_map *)0x0) &&
       (local_88 = 0, local_58 != (char *)0x0)) {
      if (offsets != (plt_offset **)0x0) {
        *offsets = (plt_offset *)0x0;
      }
      pplVar9 = &local_68;
      local_40 = local_58;
      local_88 = 0;
      bVar4 = true;
      do {
        bVar3 = bVar4;
        plVar6 = pplVar9[1];
        plVar8 = pplVar9[2];
        if (plVar8 <= plVar6) {
          ppcVar12 = &(*pplVar9)->l_name;
          uVar11 = 0;
          do {
            iVar5 = strcmp((char *)((long)&plVar10->l_addr +
                                   (ulong)(uint)(&plVar13->l_addr)
                                                [(ulong)*(uint *)((long)ppcVar12 + 4) * 3]),name);
            if (iVar5 == 0) {
              EVar2 = ((link_map *)(ppcVar12 + -1))->l_addr;
              if (EVar2 != 0) {
                if (offsets != (plt_offset **)0x0) {
                  ppVar7 = (plt_offset *)mmk_realloc(*offsets,local_88 * 0x10 + 0x10);
                  *offsets = ppVar7;
                  ppVar7[local_88].offset = (undefined1 **)((long)&ctx->r_version + EVar2);
                  ppVar7[local_88].oldval = (undefined1 *)0x0;
                }
                local_88 = local_88 + 1;
              }
              break;
            }
            uVar11 = uVar11 + 1;
            ppcVar12 = (char **)((long)ppcVar12 + (long)plVar8);
          } while (uVar11 < (ulong)plVar6 / (ulong)plVar8);
        }
        pplVar9 = &local_50;
        bVar4 = false;
      } while (bVar3);
    }
  }
  return local_88;
}

Assistant:

static size_t get_offsets(plt_ctx ctx, plt_lib lib, const char *name, plt_offset ** offsets)
{
    ElfW(Sym) *symtab   = (ElfW(Sym)*)  lib_dt_lookup(lib, DT_SYMTAB);
    const char *strtab  = (const char*) lib_dt_lookup(lib, DT_STRTAB);

    ElfW(Rel)   *jmprel = lib_dt_lookup(lib, DT_JMPREL);

    ElfWord jmprel_sz = lib_dt_lookup_val(lib, DT_PLTRELSZ);
    ElfWord relent_sz;
    ElfWord rel_sz;

    // For relocation sections try DT_RELA first, then DT_REL. We don't deal with
    // addends anyway.
    ElfW(Rel) *rel = lib_dt_lookup(lib, DT_RELA);
    if (!rel) {
        rel = lib_dt_lookup(lib, DT_REL);
        if (!rel)
            return 0;
        rel_sz = lib_dt_lookup_val(lib, DT_RELSZ);
        relent_sz = lib_dt_lookup_val(lib, DT_RELENT);
    } else {
        rel_sz = lib_dt_lookup_val(lib, DT_RELASZ);
        relent_sz = lib_dt_lookup_val(lib, DT_RELAENT);
    }

    if (!symtab || !strtab || !(rel || jmprel) || !(rel_sz || jmprel_sz) || !relent_sz)
        return 0;

    ElfW(Addr) base = (ElfW(Addr)) lib->l_addr;
#ifdef __FreeBSD__
    if (lib == ctx->r_map)
        base = 0;
#endif

    size_t n = 0;
    if (offsets) {
        *offsets = NULL;
    }

    struct rel_info info[] = {
        {
          .tab = rel,
          .size = rel_sz,
          .entry_sz = relent_sz,
        },
        {
          .tab = jmprel,
          .size = jmprel_sz,
          .entry_sz = relent_sz,
        }
    };

    for (size_t i = 0; i < sizeof(info) / sizeof(struct rel_info); ++i) {
        uintptr_t off = get_offset(&info[i], symtab, strtab, name);
        if (off) {
            if (offsets) {
                *offsets = mmk_realloc(*offsets, (n + 1) * sizeof(plt_offset));
                (*offsets)[n] = (plt_offset) { .offset = (plt_fn **)(base + off) };
            }
            ++n;
        }
    }

    return n;
}